

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void doctest::anon_unknown_14::anon_unknown_33::hexEscapeChar(ostream *os,uchar c)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  ostream *poVar3;
  void *this;
  undefined8 uVar4;
  byte in_SIL;
  ostream *in_RDI;
  fmtflags f;
  
  __fmtfl = std::ios_base::flags
                      ((ios_base *)
                       ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3]))
  ;
  poVar3 = std::operator<<(in_RDI,"\\x");
  this = (void *)std::ostream::operator<<(poVar3,std::uppercase);
  uVar4 = std::ostream::operator<<(this,std::hex);
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(uVar4,_Var1._M_c);
  _Var2 = std::setw(2);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,(uint)in_SIL);
  std::ios_base::flags
            ((ios_base *)
             ((long)&in_RDI->_vptr_basic_ostream + (long)in_RDI->_vptr_basic_ostream[-3]),__fmtfl);
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }